

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O3

void learn_batch(lda *l)

{
  sparse_parameters *psVar1;
  byte bVar2;
  lda_math_mode lVar3;
  vw *pvVar4;
  _func_void_weight_ptr_void_ptr *p_Var5;
  example *peVar6;
  float *pfVar7;
  shared_data *psVar8;
  pointer piVar9;
  uint32_t uVar10;
  pointer piVar11;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> _Var12;
  example **ppeVar13;
  vw *pvVar14;
  ostream *poVar15;
  uint uVar16;
  ulong uVar17;
  float *pfVar18;
  weight *pwVar19;
  pointer piVar20;
  weight *pwVar21;
  uint32_t *puVar22;
  ulong uVar23;
  vector<index_feature,_std::allocator<index_feature>_> *this;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  long lVar27;
  pointer piVar28;
  v_array<example_*> *this_00;
  long lVar29;
  bool bVar30;
  float fVar31;
  float fVar32;
  ulong extraout_XMM0_Qa;
  uint64_t index;
  ulong local_78;
  ulong local_70;
  float *local_68;
  float local_60;
  float local_5c;
  v_array<example_*> *local_58;
  vector<index_feature,_std::allocator<index_feature>_> *local_50;
  example **local_48;
  ulong local_40;
  example **local_38;
  
  if ((l->sorted_features).super__Vector_base<index_feature,_std::allocator<index_feature>_>._M_impl
      .super__Vector_impl_data._M_start ==
      (l->sorted_features).super__Vector_base<index_feature,_std::allocator<index_feature>_>._M_impl
      .super__Vector_impl_data._M_finish) {
    ppeVar13 = (l->examples)._begin;
    if ((l->examples)._end != ppeVar13) {
      uVar25 = 0;
      do {
        v_array<float>::clear(&(ppeVar13[uVar25]->pred).scalars);
        v_array<float>::resize(&((l->examples)._begin[uVar25]->pred).scalars,l->topics);
        memset(((l->examples)._begin[uVar25]->pred).scalars._begin,0,l->topics << 2);
        peVar6 = (l->examples)._begin[uVar25];
        (peVar6->pred).scalars._end = (peVar6->pred).scalars._begin + l->topics;
        v_array<float>::clear(&((l->examples)._begin[uVar25]->pred).scalars);
        return_example(l->all,(l->examples)._begin[uVar25]);
        uVar25 = uVar25 + 1;
        ppeVar13 = (l->examples)._begin;
      } while (uVar25 < (ulong)((long)(l->examples)._end - (long)ppeVar13 >> 3));
    }
    v_array<example_*>::clear(&l->examples);
    return;
  }
  pvVar4 = l->all;
  if ((l->total_lambda)._end == (l->total_lambda)._begin) {
    pvVar14 = pvVar4;
    if (pvVar4->lda != 0) {
      uVar25 = 0;
      do {
        local_70 = local_70 & 0xffffffff00000000;
        v_array<float>::push_back(&l->total_lambda,(float *)&local_70);
        uVar25 = uVar25 + 1;
        pvVar14 = l->all;
      } while (uVar25 < pvVar14->lda);
    }
    bVar2 = (pvVar4->weights).sparse;
    puVar22 = &(pvVar4->weights).dense_weights._stride_shift;
    if ((bool)bVar2 != false) {
      puVar22 = &(pvVar4->weights).sparse_weights._stride_shift;
    }
    uVar10 = *puVar22;
    uVar25 = (pvVar4->weights).sparse_weights._weight_mask;
    uVar17 = (pvVar4->weights).dense_weights._weight_mask;
    psVar1 = &(pvVar4->weights).sparse_weights;
    uVar26 = 0;
    do {
      if ((bVar2 & 1) == 0) {
        pwVar19 = (pvVar4->weights).dense_weights._begin + (uVar17 & uVar26);
      }
      else {
        local_78 = uVar25 & uVar26;
        _Var12._M_cur =
             (__node_type *)
             std::
             _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)psVar1,&local_78);
        if (_Var12._M_cur == (__node_type *)0x0) {
          local_68 = calloc_or_throw<float>
                               (1L << ((byte)(pvVar4->weights).sparse_weights._stride_shift & 0x3f))
          ;
          local_70 = local_78;
          std::
          _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<std::pair<unsigned_long,float*>>
                    ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)psVar1,&local_70);
          _Var12._M_cur =
               (__node_type *)
               std::
               _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)psVar1,&local_78);
          p_Var5 = (pvVar4->weights).sparse_weights.fun;
          if (p_Var5 != (_func_void_weight_ptr_void_ptr *)0x0) {
            (*p_Var5)(*(weight **)((long)_Var12._M_cur + 0x10),
                      (pvVar4->weights).sparse_weights.default_data);
          }
        }
        pwVar19 = *(weight **)
                   ((long)&((_Var12._M_cur)->
                           super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>).
                           super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>.
                           _M_storage._M_storage + 8);
        pvVar14 = l->all;
      }
      if (pvVar14->lda != 0) {
        uVar25 = 0;
        do {
          pfVar18 = (l->total_lambda)._begin;
          pfVar18[uVar25] = pwVar19[uVar25] + pfVar18[uVar25];
          uVar25 = uVar25 + 1;
          pvVar14 = l->all;
        } while (uVar25 < pvVar14->lda);
      }
      uVar26 = uVar26 + (uint)(1 << ((byte)uVar10 & 0x1f));
      bVar2 = (pvVar4->weights).sparse;
      uVar25 = (pvVar4->weights).sparse_weights._weight_mask;
      uVar17 = (pvVar4->weights).dense_weights._weight_mask;
      uVar23 = uVar17;
      if ((bool)bVar2 != false) {
        uVar23 = uVar25;
      }
    } while (uVar26 <= uVar23);
  }
  l->example_t = l->example_t + 1.0;
  v_array<float>::clear(&l->total_new);
  pvVar14 = l->all;
  if (pvVar14->lda != 0) {
    uVar25 = 0;
    do {
      local_70 = local_70 & 0xffffffff00000000;
      v_array<float>::push_back(&l->total_new,(float *)&local_70);
      uVar25 = uVar25 + 1;
      pvVar14 = l->all;
    } while (uVar25 < pvVar14->lda);
  }
  local_38 = (l->examples)._begin;
  local_48 = (l->examples)._end;
  uVar25 = (long)local_48 - (long)local_38 >> 3;
  piVar28 = (l->sorted_features).super__Vector_base<index_feature,_std::allocator<index_feature>_>.
            _M_impl.super__Vector_impl_data._M_start;
  piVar20 = (l->sorted_features).super__Vector_base<index_feature,_std::allocator<index_feature>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (piVar28 != piVar20) {
    uVar17 = ((long)piVar20 - (long)piVar28 >> 3) * -0x5555555555555555;
    lVar27 = 0x3f;
    if (uVar17 != 0) {
      for (; uVar17 >> lVar27 == 0; lVar27 = lVar27 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<index_feature*,std::vector<index_feature,std::allocator<index_feature>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (piVar28,piVar20,((uint)lVar27 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<index_feature*,std::vector<index_feature,std::allocator<index_feature>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (piVar28,piVar20);
    pvVar14 = l->all;
  }
  fVar32 = pvVar14->eta;
  local_60 = lda::powf(l,(float)l->example_t,-pvVar14->power_t);
  local_60 = local_60 * fVar32;
  local_5c = 1.0 - local_60;
  local_58 = (v_array<example_*> *)CONCAT44(local_58._4_4_,(float)uVar25);
  local_50 = (vector<index_feature,_std::allocator<index_feature>_> *)
             CONCAT44(local_50._4_4_,l->lda_D);
  fVar32 = (l->decay_levels)._end[-1];
  fVar31 = logf(local_5c);
  local_70 = CONCAT44(local_70._4_4_,fVar31 + fVar32);
  v_array<float>::push_back(&l->decay_levels,(float *)&local_70);
  v_array<float>::clear(&l->digammas);
  uVar10 = l->all->num_bits;
  local_40 = uVar25;
  if (l->all->lda != 0) {
    fVar32 = l->lda_rho;
    uVar25 = 0;
    do {
      fVar31 = lda::digamma(l,(l->total_lambda)._begin[uVar25] +
                              (float)(ulong)(1L << ((byte)uVar10 & 0x3f)) * fVar32);
      local_70 = CONCAT44(local_70._4_4_,fVar31);
      v_array<float>::push_back(&l->digammas,(float *)&local_70);
      uVar25 = uVar25 + 1;
    } while (uVar25 < l->all->lda);
  }
  piVar28 = (l->sorted_features).super__Vector_base<index_feature,_std::allocator<index_feature>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (piVar28 <=
      (l->sorted_features).super__Vector_base<index_feature,_std::allocator<index_feature>_>._M_impl
      .super__Vector_impl_data._M_finish + -1) {
    psVar1 = &(pvVar4->weights).sparse_weights;
    uVar25 = 0xffffffffffffffff;
    do {
      uVar17 = (piVar28->f).weight_index;
      if (uVar25 != uVar17) {
        bVar30 = (pvVar4->weights).sparse;
        uVar25 = (pvVar4->weights).sparse_weights._weight_mask;
        uVar26 = (pvVar4->weights).dense_weights._weight_mask;
        uVar23 = uVar26;
        if (bVar30 != false) {
          uVar23 = uVar25;
        }
        if (bVar30 == true) {
          local_78 = uVar23 & uVar17 & uVar25;
          _Var12._M_cur =
               (__node_type *)
               std::
               _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)psVar1,&local_78);
          if (_Var12._M_cur == (__node_type *)0x0) {
            local_68 = calloc_or_throw<float>
                                 (1L << ((byte)(pvVar4->weights).sparse_weights._stride_shift & 0x3f
                                        ));
            local_70 = local_78;
            std::
            _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<std::pair<unsigned_long,float*>>
                      ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)psVar1,&local_70);
            _Var12._M_cur =
                 (__node_type *)
                 std::
                 _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         *)psVar1,&local_78);
            p_Var5 = (pvVar4->weights).sparse_weights.fun;
            if (p_Var5 != (_func_void_weight_ptr_void_ptr *)0x0) {
              (*p_Var5)(*(weight **)((long)_Var12._M_cur + 0x10),
                        (pvVar4->weights).sparse_weights.default_data);
            }
          }
          pwVar19 = *(weight **)
                     ((long)&((_Var12._M_cur)->
                             super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>)
                             .super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>.
                             _M_storage._M_storage + 8);
        }
        else {
          pwVar19 = (pvVar4->weights).dense_weights._begin + (uVar23 & uVar17 & uVar26);
        }
        pfVar18 = (l->decay_levels)._end;
        fVar32 = expf(pfVar18[-2] -
                      pfVar18[(int)((double)pwVar19[l->all->lda] + (-1.0 - l->example_t))]);
        if (1.0 <= fVar32) {
          fVar32 = 1.0;
        }
        pfVar18 = pwVar19 + (ulong)l->all->lda + 1;
        pfVar18[-1] = (float)l->example_t;
        pvVar14 = l->all;
        if (pvVar14->lda == 0) {
          uVar26 = 0;
        }
        else {
          uVar25 = 0;
          do {
            fVar31 = pwVar19[uVar25];
            pwVar19[uVar25] = fVar31 * fVar32;
            pfVar18[uVar25] = fVar31 * fVar32 + l->lda_rho;
            uVar25 = uVar25 + 1;
            pvVar14 = l->all;
            uVar26 = (ulong)pvVar14->lda;
          } while (uVar25 < uVar26);
        }
        pfVar7 = (l->digammas)._begin;
        lVar3 = l->mmode;
        uVar25 = uVar17;
        if (lVar3 == USE_SIMD) {
          ldamath::vexpdigammify_2(pvVar14,pfVar18,pfVar7,1e-10);
        }
        else if (lVar3 == USE_PRECISE) {
          std::
          transform<float*,float*,float*,ldamath::expdigammify_2<float,(lda_math_mode)1>(vw&,float*,float*,float)::_lambda(float,float)_1_>
                    (pfVar18,pfVar18 + uVar26,pfVar7,pfVar18,(anon_class_4_1_b97a6b0b)0x2edbe6ff);
        }
        else {
          if (lVar3 != USE_FAST_APPROX) {
            poVar15 = std::operator<<((ostream *)&std::cerr,
                                      "lda::expdigammify_2: Trampled or invalid math mode, aborting"
                                     );
            std::endl<char,std::char_traits<char>>(poVar15);
            abort();
          }
          std::
          transform<float*,float*,float*,ldamath::expdigammify_2<float,(lda_math_mode)2>(vw&,float*,float*,float)::_lambda(float,float)_1_>
                    (pfVar18,pfVar18 + uVar26,pfVar7,pfVar18,(anon_class_4_1_b97a6b0b)0x2edbe6ff);
        }
      }
      piVar28 = piVar28 + 1;
    } while (piVar28 <=
             (l->sorted_features).super__Vector_base<index_feature,_std::allocator<index_feature>_>.
             _M_impl.super__Vector_impl_data._M_finish + -1);
  }
  this_00 = &l->examples;
  local_60 = local_60 * (local_50._0_4_ / local_58._0_4_);
  uVar25 = (ulong)(uint)local_60;
  if (local_48 != local_38) {
    lVar27 = local_40 + (local_40 == 0);
    lVar29 = 0;
    do {
      fVar32 = lda_loop(l,&l->Elogtheta,(l->v)._begin + (ulong)l->all->lda * lVar29,
                        (l->examples)._begin[lVar29],(float)uVar25);
      pvVar14 = l->all;
      if (pvVar14->audit == true) {
        GD::print_audit_features(pvVar14,(l->examples)._begin[lVar29]);
        pvVar14 = l->all;
      }
      if (0 < (l->doc_lengths)._begin[lVar29]) {
        pvVar14->sd->sum_loss = pvVar14->sd->sum_loss - (double)fVar32;
        psVar8 = l->all->sd;
        psVar8->sum_loss_since_last_dump = psVar8->sum_loss_since_last_dump - (double)fVar32;
        pvVar14 = l->all;
      }
      return_example(pvVar14,this_00->_begin[lVar29]);
      lVar29 = lVar29 + 1;
      uVar25 = extraout_XMM0_Qa;
    } while (lVar27 != lVar29);
  }
  this = &l->sorted_features;
  if ((local_60 != 0.0) || (NAN(local_60))) {
    piVar28 = (l->sorted_features).super__Vector_base<index_feature,_std::allocator<index_feature>_>
              ._M_impl.super__Vector_impl_data._M_start;
    piVar20 = (l->sorted_features).super__Vector_base<index_feature,_std::allocator<index_feature>_>
              ._M_impl.super__Vector_impl_data._M_finish + -1;
    local_50 = this;
    if (piVar20 < piVar28) {
      pvVar14 = l->all;
    }
    else {
      psVar1 = &(pvVar4->weights).sparse_weights;
      local_58 = this_00;
      do {
        uVar25 = (piVar28->f).weight_index;
        piVar11 = piVar28;
        do {
          piVar9 = piVar11;
          if (piVar20 < piVar9 + 1) break;
          piVar11 = piVar9 + 1;
        } while (piVar9[1].f.weight_index == uVar25);
        if ((pvVar4->weights).sparse == true) {
          local_78 = uVar25 & (pvVar4->weights).sparse_weights._weight_mask;
          _Var12._M_cur =
               (__node_type *)
               std::
               _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)psVar1,&local_78);
          if (_Var12._M_cur == (__node_type *)0x0) {
            local_68 = calloc_or_throw<float>
                                 (1L << ((byte)(pvVar4->weights).sparse_weights._stride_shift & 0x3f
                                        ));
            local_70 = local_78;
            std::
            _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<std::pair<unsigned_long,float*>>
                      ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)psVar1,&local_70);
            _Var12._M_cur =
                 (__node_type *)
                 std::
                 _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         *)psVar1,&local_78);
            p_Var5 = (pvVar4->weights).sparse_weights.fun;
            if (p_Var5 != (_func_void_weight_ptr_void_ptr *)0x0) {
              (*p_Var5)(*(weight **)((long)_Var12._M_cur + 0x10),
                        (pvVar4->weights).sparse_weights.default_data);
            }
          }
          pwVar19 = *(weight **)
                     ((long)&((_Var12._M_cur)->
                             super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>)
                             .super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>.
                             _M_storage._M_storage + 8);
        }
        else {
          pwVar19 = (pvVar4->weights).dense_weights._begin +
                    (uVar25 & (pvVar4->weights).dense_weights._weight_mask);
        }
        pvVar14 = l->all;
        piVar20 = piVar28;
        if (pvVar14->lda != 0) {
          uVar25 = 0;
          do {
            pwVar19[uVar25] = pwVar19[uVar25] * local_5c;
            uVar25 = uVar25 + 1;
            pvVar14 = l->all;
          } while (uVar25 < pvVar14->lda);
        }
        do {
          uVar16 = pvVar14->lda;
          uVar24 = piVar20->document * uVar16;
          uVar25 = (piVar20->f).weight_index;
          pfVar18 = (l->v)._begin;
          if ((pvVar4->weights).sparse == true) {
            local_78 = uVar25 & (pvVar4->weights).sparse_weights._weight_mask;
            _Var12._M_cur =
                 (__node_type *)
                 std::
                 _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         *)psVar1,&local_78);
            if (_Var12._M_cur == (__node_type *)0x0) {
              local_68 = calloc_or_throw<float>
                                   (1L << ((byte)(pvVar4->weights).sparse_weights._stride_shift &
                                          0x3f));
              local_70 = local_78;
              std::
              _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              ::_M_emplace<std::pair<unsigned_long,float*>>
                        ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                          *)psVar1,&local_70);
              _Var12._M_cur =
                   (__node_type *)
                   std::
                   _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           *)psVar1,&local_78);
              p_Var5 = (pvVar4->weights).sparse_weights.fun;
              if (p_Var5 != (_func_void_weight_ptr_void_ptr *)0x0) {
                (*p_Var5)(*(weight **)((long)_Var12._M_cur + 0x10),
                          (pvVar4->weights).sparse_weights.default_data);
              }
            }
            pwVar19 = *(weight **)
                       ((long)&((_Var12._M_cur)->
                               super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>
                               ).
                               super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>
                               ._M_storage._M_storage + 8);
            pvVar14 = l->all;
            uVar16 = pvVar14->lda;
          }
          else {
            pwVar19 = (pvVar4->weights).dense_weights._begin +
                      (uVar25 & (pvVar4->weights).dense_weights._weight_mask);
          }
          uVar25 = (ulong)uVar16;
          if (l->topics == 0) {
            fVar32 = 0.0;
          }
          else {
            fVar32 = 0.0;
            lVar27 = 0;
            do {
              fVar32 = fVar32 + *(float *)((long)pwVar19 + lVar27 + uVar25 * 4 + 4) *
                                *(float *)((long)pfVar18 + lVar27 + (ulong)uVar24 * 4);
              lVar27 = lVar27 + 4;
            } while (l->topics << 2 != lVar27);
          }
          fVar32 = (1.0 / fVar32) * local_60 * (piVar20->f).x;
          uVar17 = (piVar20->f).weight_index;
          if ((pvVar4->weights).sparse == true) {
            local_48 = (example **)CONCAT44(local_48._4_4_,fVar32);
            local_78 = uVar17 & (pvVar4->weights).sparse_weights._weight_mask;
            _Var12._M_cur =
                 (__node_type *)
                 std::
                 _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         *)psVar1,&local_78);
            if (_Var12._M_cur == (__node_type *)0x0) {
              local_68 = calloc_or_throw<float>
                                   (1L << ((byte)(pvVar4->weights).sparse_weights._stride_shift &
                                          0x3f));
              local_70 = local_78;
              std::
              _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              ::_M_emplace<std::pair<unsigned_long,float*>>
                        ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                          *)psVar1,&local_70);
              _Var12._M_cur =
                   (__node_type *)
                   std::
                   _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           *)psVar1,&local_78);
              p_Var5 = (pvVar4->weights).sparse_weights.fun;
              if (p_Var5 != (_func_void_weight_ptr_void_ptr *)0x0) {
                (*p_Var5)(*(weight **)((long)_Var12._M_cur + 0x10),
                          (pvVar4->weights).sparse_weights.default_data);
              }
            }
            pwVar21 = *(weight **)
                       ((long)&((_Var12._M_cur)->
                               super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>
                               ).
                               super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>
                               ._M_storage._M_storage + 8);
            pvVar14 = l->all;
            uVar16 = pvVar14->lda;
            fVar32 = local_48._0_4_;
          }
          else {
            pwVar21 = (pvVar4->weights).dense_weights._begin +
                      (uVar17 & (pvVar4->weights).dense_weights._weight_mask);
          }
          if (uVar16 != 0) {
            uVar17 = 0;
            do {
              fVar31 = pwVar19[uVar25 + uVar17 + 1] * pfVar18[uVar24 + uVar17] * fVar32;
              pfVar7 = (l->total_new)._begin;
              pfVar7[uVar17] = pfVar7[uVar17] + fVar31;
              pwVar21[uVar17] = fVar31 + pwVar21[uVar17];
              uVar17 = uVar17 + 1;
              pvVar14 = l->all;
            } while (uVar17 < pvVar14->lda);
          }
          piVar28 = piVar20 + 1;
          bVar30 = piVar9 != piVar20;
          piVar20 = piVar28;
        } while (bVar30);
        piVar20 = (l->sorted_features).
                  super__Vector_base<index_feature,_std::allocator<index_feature>_>._M_impl.
                  super__Vector_impl_data._M_finish + -1;
        this_00 = local_58;
      } while (piVar28 <= piVar20);
    }
    this = local_50;
    if (pvVar14->lda != 0) {
      uVar25 = 0;
      do {
        pfVar18 = (l->total_lambda)._begin;
        pfVar18[uVar25] = pfVar18[uVar25] * local_5c;
        pfVar18 = (l->total_lambda)._begin;
        pfVar18[uVar25] = (l->total_new)._begin[uVar25] + pfVar18[uVar25];
        uVar25 = uVar25 + 1;
      } while (uVar25 < l->all->lda);
    }
  }
  std::vector<index_feature,_std::allocator<index_feature>_>::resize(this,0);
  v_array<example_*>::clear(this_00);
  v_array<int>::clear(&l->doc_lengths);
  return;
}

Assistant:

void learn_batch(lda &l)
{
  parameters &weights = l.all->weights;
  if (l.sorted_features.empty())  // FAST-PASS for real "true"
  {
    // This can happen when the socket connection is dropped by the client.
    // If l.sorted_features is empty, then l.sorted_features[0] does not
    // exist, so we should not try to take its address in the beginning of
    // the for loops down there. Since it seems that there's not much to
    // do in this case, we just return.
    for (size_t d = 0; d < l.examples.size(); d++)
    {
      l.examples[d]->pred.scalars.clear();
      l.examples[d]->pred.scalars.resize(l.topics);
      memset(l.examples[d]->pred.scalars.begin(), 0, l.topics * sizeof(float));
      l.examples[d]->pred.scalars.end() = l.examples[d]->pred.scalars.begin() + l.topics;

      l.examples[d]->pred.scalars.clear();
      return_example(*l.all, *l.examples[d]);
    }
    l.examples.clear();
    return;
  }

  float eta = -1;
  float minuseta = -1;

  if (l.total_lambda.size() == 0)
  {
    for (size_t k = 0; k < l.all->lda; k++) l.total_lambda.push_back(0.f);
    // This part does not work with sparse parameters
    size_t stride = weights.stride();
    for (size_t i = 0; i <= weights.mask(); i += stride)
    {
      weight *w = &(weights[i]);
      for (size_t k = 0; k < l.all->lda; k++) l.total_lambda[k] += w[k];
    }
  }

  l.example_t++;
  l.total_new.clear();
  for (size_t k = 0; k < l.all->lda; k++) l.total_new.push_back(0.f);

  size_t batch_size = l.examples.size();

  sort(l.sorted_features.begin(), l.sorted_features.end());

  eta = l.all->eta * l.powf((float)l.example_t, -l.all->power_t);
  minuseta = 1.0f - eta;
  eta *= l.lda_D / batch_size;
  l.decay_levels.push_back(l.decay_levels.last() + log(minuseta));

  l.digammas.clear();
  float additional = (float)(l.all->length()) * l.lda_rho;
  for (size_t i = 0; i < l.all->lda; i++) l.digammas.push_back(l.digamma(l.total_lambda[i] + additional));

  uint64_t last_weight_index = -1;
  for (index_feature *s = &l.sorted_features[0]; s <= &l.sorted_features.back(); s++)
  {
    if (last_weight_index == s->f.weight_index)
      continue;
    last_weight_index = s->f.weight_index;
    // float *weights_for_w = &(weights[s->f.weight_index]);
    float *weights_for_w = &(weights[s->f.weight_index & weights.mask()]);
    float decay_component =
        l.decay_levels.end()[-2] - l.decay_levels.end()[(int)(-1 - l.example_t + *(weights_for_w + l.all->lda))];
    float decay = fmin(1.0f, correctedExp(decay_component));
    float *u_for_w = weights_for_w + l.all->lda + 1;

    *(weights_for_w + l.all->lda) = (float)l.example_t;
    for (size_t k = 0; k < l.all->lda; k++)
    {
      weights_for_w[k] *= decay;
      u_for_w[k] = weights_for_w[k] + l.lda_rho;
    }

    l.expdigammify_2(*l.all, u_for_w, l.digammas.begin());
  }

  for (size_t d = 0; d < batch_size; d++)
  {
    float score = lda_loop(l, l.Elogtheta, &(l.v[d * l.all->lda]), l.examples[d], l.all->power_t);
    if (l.all->audit)
      GD::print_audit_features(*l.all, *l.examples[d]);
    // If the doc is empty, give it loss of 0.
    if (l.doc_lengths[d] > 0)
    {
      l.all->sd->sum_loss -= score;
      l.all->sd->sum_loss_since_last_dump -= score;
    }
    return_example(*l.all, *l.examples[d]);
  }

  // -t there's no need to update weights (especially since it's a noop)
  if (eta != 0)
  {
    for (index_feature *s = &l.sorted_features[0]; s <= &l.sorted_features.back();)
    {
      index_feature *next = s + 1;
      while (next <= &l.sorted_features.back() && next->f.weight_index == s->f.weight_index) next++;

      float *word_weights = &(weights[s->f.weight_index]);
      for (size_t k = 0; k < l.all->lda; k++, ++word_weights)
      {
        float new_value = minuseta * *word_weights;
        *word_weights = new_value;
      }

      for (; s != next; s++)
      {
        float *v_s = &(l.v[s->document * l.all->lda]);
        float *u_for_w = &(weights[s->f.weight_index]) + l.all->lda + 1;
        float c_w = eta * find_cw(l, u_for_w, v_s) * s->f.x;
        word_weights = &(weights[s->f.weight_index]);
        for (size_t k = 0; k < l.all->lda; k++, ++u_for_w, ++word_weights)
        {
          float new_value = *u_for_w * v_s[k] * c_w;
          l.total_new[k] += new_value;
          *word_weights += new_value;
        }
      }
    }

    for (size_t k = 0; k < l.all->lda; k++)
    {
      l.total_lambda[k] *= minuseta;
      l.total_lambda[k] += l.total_new[k];
    }
  }
  l.sorted_features.resize(0);

  l.examples.clear();
  l.doc_lengths.clear();
}